

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataFile.cc
# Opt level: O2

void __thiscall avro::DataFileReaderBase::readHeader(DataFileReaderBase *this)

{
  Metadata *this_00;
  _Rb_tree_header *p_Var1;
  element_type *peVar2;
  bool bVar3;
  __type _Var4;
  iterator iVar5;
  Exception *pEVar6;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *v;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *v_00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *v_01;
  _Base_ptr this_01;
  undefined1 auVar7 [16];
  string local_1e8;
  Magic m;
  shared_ptr<avro::Node> local_1c0;
  istringstream iss;
  
  peVar2 = (this->decoder_).px;
  (*peVar2->_vptr_Decoder[2])(peVar2,(this->stream_)._M_ptr);
  codec_traits<boost::array<unsigned_char,_4UL>_>::decode((this->decoder_).px,&m);
  bVar3 = boost::operator!=((array<unsigned_char,_4UL> *)&magic,&m);
  if (bVar3) {
    pEVar6 = (Exception *)__cxa_allocate_exception(0x18);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&iss,
                   "Invalid data file. Magic does not match: ",&this->filename_);
    Exception::Exception(pEVar6,(string *)&iss);
    __cxa_throw(pEVar6,&Exception::typeinfo,Exception::~Exception);
  }
  this_00 = &this->metadata_;
  codec_traits<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
  ::decode((this->decoder_).px,this_00);
  iVar5 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
          ::find(&this_00->_M_t,(key_type *)(anonymous_namespace)::AVRO_SCHEMA_KEY_abi_cxx11_);
  p_Var1 = &(this->metadata_)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)iVar5._M_node != p_Var1) {
    toString_abi_cxx11_(&local_1e8,(avro *)(iVar5._M_node + 2),v);
    std::__cxx11::istringstream::istringstream((istringstream *)&iss,(string *)&local_1e8,_S_in);
    std::__cxx11::string::~string((string *)&local_1e8);
    ValidSchema::ValidSchema((ValidSchema *)&local_1e8);
    compileJsonSchema((istream *)&iss,(ValidSchema *)&local_1e8);
    local_1c0.px = (element_type *)local_1e8._M_dataplus._M_p;
    local_1c0.pn.pi_ = (sp_counted_base *)local_1e8._M_string_length;
    if ((sp_counted_base *)local_1e8._M_string_length != (sp_counted_base *)0x0) {
      LOCK();
      *(uint_least32_t *)(local_1e8._M_string_length + 8) =
           *(uint_least32_t *)(local_1e8._M_string_length + 8) + 1;
      UNLOCK();
    }
    boost::detail::shared_count::~shared_count((shared_count *)&local_1e8._M_string_length);
    std::__cxx11::istringstream::~istringstream((istringstream *)&iss);
    boost::shared_ptr<avro::Node>::operator=(&(this->dataSchema_).root_,&local_1c0);
    boost::detail::shared_count::~shared_count(&local_1c0.pn);
    if ((this->readerSchema_).root_.px == (element_type *)0x0) {
      boost::shared_ptr<avro::Node>::operator=
                (&(this->readerSchema_).root_,&(this->dataSchema_).root_);
    }
    iVar5 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
            ::find(&this_00->_M_t,(key_type *)(anonymous_namespace)::AVRO_CODEC_KEY_abi_cxx11_);
    if ((_Rb_tree_header *)iVar5._M_node == p_Var1) {
      this->codec_ = NULL_CODEC;
    }
    else {
      this_01 = iVar5._M_node + 2;
      toString_abi_cxx11_((string *)&iss,(avro *)this_01,v_00);
      _Var4 = std::operator==((string *)&iss,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (anonymous_namespace)::AVRO_DEFLATE_CODEC_abi_cxx11_);
      std::__cxx11::string::~string((string *)&iss);
      if (_Var4) {
        this->codec_ = DEFLATE_CODEC;
      }
      else {
        this->codec_ = NULL_CODEC;
        toString_abi_cxx11_((string *)&iss,(avro *)this_01,v_01);
        bVar3 = std::operator!=((string *)&iss,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )(anonymous_namespace)::AVRO_NULL_CODEC_abi_cxx11_);
        std::__cxx11::string::~string((string *)&iss);
        if (bVar3) {
          auVar7 = __cxa_allocate_exception(0x18);
          toString_abi_cxx11_(&local_1e8,(avro *)this_01,auVar7._8_8_);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&iss,
                         "Unknown codec in data file: ",&local_1e8);
          Exception::Exception(auVar7._0_8_,(string *)&iss);
          __cxa_throw(auVar7._0_8_,&Exception::typeinfo,Exception::~Exception);
        }
      }
    }
    codec_traits<boost::array<unsigned_char,_16UL>_>::decode((this->decoder_).px,&this->sync_);
    return;
  }
  pEVar6 = (Exception *)__cxa_allocate_exception(0x18);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&iss,"No schema in metadata",(allocator<char> *)&local_1e8);
  Exception::Exception(pEVar6,(string *)&iss);
  __cxa_throw(pEVar6,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

void DataFileReaderBase::readHeader()
{
    decoder_->init(*stream_);
    Magic m;
    avro::decode(*decoder_, m);
    if (magic != m) {
        throw Exception("Invalid data file. Magic does not match: "
            + filename_);
    }
    avro::decode(*decoder_, metadata_);
    Metadata::const_iterator it = metadata_.find(AVRO_SCHEMA_KEY);
    if (it == metadata_.end()) {
        throw Exception("No schema in metadata");
    }

    dataSchema_ = makeSchema(it->second);
    if (! readerSchema_.root()) {
        readerSchema_ = dataSchema();
    }

    it = metadata_.find(AVRO_CODEC_KEY);
    if (it != metadata_.end() && toString(it->second) == AVRO_DEFLATE_CODEC) {
        codec_ = DEFLATE_CODEC;
    } else {
        codec_ = NULL_CODEC;
        if (it != metadata_.end() && toString(it->second) != AVRO_NULL_CODEC) {
            throw Exception("Unknown codec in data file: " + toString(it->second));
        }
    }

    avro::decode(*decoder_, sync_);
}